

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLCh __thiscall xercesc_4_0::ReaderMgr::peekNextChar(ReaderMgr *this)

{
  bool bVar1;
  XMLCh local_1a;
  ReaderMgr *pRStack_18;
  XMLCh chRet;
  ReaderMgr *this_local;
  
  pRStack_18 = this;
  bVar1 = XMLReader::peekNextChar(this->fCurReader,&local_1a);
  if (bVar1) {
    this_local._6_2_ = local_1a;
  }
  else {
    bVar1 = popReader(this);
    if (bVar1) {
      XMLReader::peekNextChar(this->fCurReader,&local_1a);
      this_local._6_2_ = local_1a;
    }
    else {
      this_local._6_2_ = L'\0';
    }
  }
  return this_local._6_2_;
}

Assistant:

XMLCh ReaderMgr::peekNextChar()
{
    XMLCh chRet;
    if (fCurReader->peekNextChar(chRet))
        return chRet;

    //
    //  Didn't get anything back so this reader is hosed. So lets move to
    //  the next reader on the stack. If this fails, it will be because
    //  its the end of the original file, and we just return zero.
    //
    if (!popReader())
        return XMLCh(0);

    // Else peek again and return the character
    fCurReader->peekNextChar(chRet);
    return chRet;
}